

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void cave_unlight(point_set *ps)

{
  loc_conflict grid_00;
  _Bool _Var1;
  square_conflict *psVar2;
  loc grid;
  wchar_t i;
  point_set *ps_local;
  
  for (grid.x = 0; grid.x < ps->n; grid.x = grid.x + 1) {
    grid_00 = *(loc_conflict *)(ps->pts + grid.x);
    _Var1 = square_isbright((chunk *)cave,*(loc_conflict *)(ps->pts + grid.x));
    if (!_Var1) {
      psVar2 = square((chunk *)cave,*(loc_conflict *)(ps->pts + grid.x));
      flag_off(psVar2->info,3,2);
    }
    _Var1 = flag_has_dbg((player->state).pflags,3,0xc,"player->state.pflags","(PF_UNLIGHT)");
    if (_Var1) {
      square_memorize((chunk *)cave,grid_00);
    }
    _Var1 = square_isfloor((chunk *)cave,grid_00);
    if (_Var1) {
      square_forget((chunk *)cave,grid_00);
    }
  }
  for (grid.x = 0; grid.x < ps->n; grid.x = grid.x + 1) {
    square_light_spot((chunk *)cave,ps->pts[grid.x]);
  }
  return;
}

Assistant:

static void cave_unlight(struct point_set *ps)
{
	int i;

	/* Apply flag changes */
	for (i = 0; i < ps->n; i++)	{
		struct loc grid = ps->pts[i];

		/* Darken the grid... */
		if (!square_isbright(cave, ps->pts[i])) {
			sqinfo_off(square(cave, ps->pts[i])->info, SQUARE_GLOW);
		}

		/* ...but dark-loving characters remember them */
		if (player_has(player, PF_UNLIGHT)) {
			square_memorize(cave, grid);
		}

		/* Hack -- Forget "boring" grids */
		if (square_isfloor(cave, grid))
			square_forget(cave, grid);
	}

	/* Process the grids */
	for (i = 0; i < ps->n; i++)	{
		/* Redraw the grid */
		square_light_spot(cave, ps->pts[i]);
	}
}